

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O3

blargg_err_t __thiscall Blip_Buffer::sample_rate(Blip_Buffer *this,long new_rate,int msec)

{
  int iVar1;
  buf_t_ *pbVar2;
  uint uVar3;
  ulong uVar4;
  
  if (msec == 0) {
    uVar4 = 0xffffffa8;
  }
  else {
    uVar4 = ((msec + 1) * new_rate + 999) / 1000;
    if (0x1ffffff4 < uVar4 >> 3) {
      __assert_fail("( \"unmet requirement\", false )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Buffer.cpp"
                    ,0x36,"blargg_err_t Blip_Buffer::sample_rate(long, int)");
    }
  }
  uVar3 = (uint)uVar4;
  if (this->buffer_size_ != uVar3) {
    if (this->buffer_ != (buf_t_ *)0x0) {
      operator_delete__(this->buffer_);
    }
    this->offset_ = 0;
    this->buffer_ = (buf_t_ *)0x0;
    this->buffer_size_ = 0;
    pbVar2 = (buf_t_ *)operator_new__((uVar4 & 0xffffffff) * 2 + 0x30,(nothrow_t *)&std::nothrow);
    this->buffer_ = pbVar2;
    if (pbVar2 == (buf_t_ *)0x0) {
      return "Out of memory";
    }
  }
  iVar1 = SUB164(ZEXT416(uVar3 * 1000) / SEXT816(new_rate),0) + -1;
  this->buffer_size_ = uVar3;
  this->length_ = iVar1;
  if ((msec != 0) && (iVar1 != msec)) {
    __assert_fail("length_ == msec",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Buffer.cpp"
                  ,0x47,"blargg_err_t Blip_Buffer::sample_rate(long, int)");
  }
  this->samples_per_sec = new_rate;
  if (this->clocks_per_sec != 0) {
    clock_rate(this,this->clocks_per_sec);
  }
  bass_freq(this,this->bass_freq_);
  this->offset_ = 0;
  this->reader_accum = 0;
  memset(this->buffer_,0x7f,(ulong)this->buffer_size_ * 2 + 0x30);
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Blip_Buffer::sample_rate( long new_rate, int msec )
{
	unsigned new_size = (unsigned)(ULONG_MAX >> BLIP_BUFFER_ACCURACY) + 1 - widest_impulse_ - 64;
	if ( msec != blip_default_length )
	{
		size_t s = (new_rate * (msec + 1) + 999) / 1000;
		if ( s < new_size )
			new_size = s;
		else
			require( false ); // requested buffer length exceeds limit
	}
	
	if ( buffer_size_ != new_size )
	{
		delete [] buffer_;
		buffer_ = NULL; // allow for exception in allocation below
		buffer_size_ = 0;
		offset_ = 0;
		
		buffer_ = BLARGG_NEW buf_t_ [new_size + widest_impulse_];
		BLARGG_CHECK_ALLOC( buffer_ );
	}
	
	buffer_size_ = new_size;
	length_ = new_size * 1000 / new_rate - 1;
	if ( msec )
		assert( length_ == msec ); // ensure length is same as that passed in
	
	samples_per_sec = new_rate;
	if ( clocks_per_sec )
		clock_rate( clocks_per_sec ); // recalculate factor
	
	bass_freq( bass_freq_ ); // recalculate shift
	
	clear();
	
	return blargg_success;
}